

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O3

void __thiscall libtorrent::dht::find_data::start(find_data *this)

{
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> *__range3;
  node_entry *n;
  pointer pnVar1;
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> nodes;
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> local_58;
  endpoint local_3c;
  
  if ((this->super_traversal_algorithm).m_results.
      super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_traversal_algorithm).m_results.
      super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    routing_table::find_node
              (&local_58,&((this->super_traversal_algorithm).m_node)->m_table,
               &(this->super_traversal_algorithm).m_target,(find_nodes_flags_t)0x1,0);
    if (local_58.
        super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pnVar1 = local_58.
               super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        aux::union_endpoint::operator_cast_to_basic_endpoint(&local_3c,&pnVar1->endpoint);
        traversal_algorithm::add_entry
                  (&this->super_traversal_algorithm,&pnVar1->id,&local_3c,(observer_flags_t)0x2);
        pnVar1 = pnVar1 + 1;
      } while (pnVar1 != local_58.
                         super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_58.
        super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  traversal_algorithm::start(&this->super_traversal_algorithm);
  return;
}

Assistant:

void find_data::start()
{
	// if the user didn't add seed-nodes manually, grab k (bucket size)
	// nodes from routing table.
	if (m_results.empty())
	{
		std::vector<node_entry> const nodes = m_node.m_table.find_node(
			target(), routing_table::include_failed);

		for (auto const& n : nodes)
		{
			add_entry(n.id, n.ep(), observer::flag_initial);
		}
	}

	traversal_algorithm::start();
}